

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

Group * __thiscall
metaf::GroupParser::reparseAlternative<12ul>
          (Group *__return_storage_ptr__,GroupParser *this,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata,size_t ignoreIndex)

{
  long lVar1;
  optional<metaf::MinMaxTemperatureGroup> *poVar2;
  Group *pGVar3;
  byte bVar4;
  optional<metaf::MinMaxTemperatureGroup> parsed;
  optional<metaf::MinMaxTemperatureGroup> local_7c;
  
  bVar4 = 0;
  if (reportMetadata == (ReportMetadata *)0xc) goto LAB_001b2a63;
  if ((int)group == 4) {
    MinMaxTemperatureGroup::from6hourly(&local_7c,(string *)this);
    if ((local_7c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_engaged == false) &&
       (MinMaxTemperatureGroup::from24hourly(&local_7c,(string *)this),
       local_7c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_engaged == false))
    goto LAB_001b2a3f;
  }
  else if ((int)group == 3) {
    MinMaxTemperatureGroup::fromForecast(&local_7c,(string *)this);
  }
  else {
LAB_001b2a3f:
    local_7c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_engaged = false;
  }
  if (local_7c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_engaged == true) {
    poVar2 = &local_7c;
    pGVar3 = __return_storage_ptr__;
    for (lVar1 = 0x12; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(Type *)&(pGVar3->
                super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                ).
                super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                .
                super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                .
                super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                .
                super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                .
                super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                ._M_u =
           (poVar2->super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.t;
      poVar2 = (optional<metaf::MinMaxTemperatureGroup> *)
               ((long)poVar2 + ((ulong)bVar4 * -2 + 1) * 4);
      pGVar3 = (Group *)((long)pGVar3 + (ulong)bVar4 * -8 + 4);
    }
    (__return_storage_ptr__->
    super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    ).
    super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    ._M_index = '\f';
    return __return_storage_ptr__;
  }
LAB_001b2a63:
  reparseAlternative<13ul>
            (__return_storage_ptr__,this,(string *)((ulong)group & 0xffffffff),reportPart,
             reportMetadata,ignoreIndex);
  return __return_storage_ptr__;
}

Assistant:

static Group reparseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata,
		size_t ignoreIndex)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			if (I != ignoreIndex) {
				const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
				if (parsed.has_value()) return *parsed;
			}
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return reparseAlternative<I+1>(group, reportPart, reportMetadata, ignoreIndex);
		}
	}